

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkPrintFinResults(Vec_Wec_t *vClasses)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p;
  int i;
  int i_00;
  
  for (i = 0; i < vClasses->nSize; i = i + 1) {
    p = Vec_WecEntry(vClasses,i);
    for (i_00 = 1; i_00 < p->nSize; i_00 = i_00 + 1) {
      uVar1 = Vec_IntEntry(p,i_00);
      uVar2 = Vec_IntEntry(p,0);
      printf("%d %d\n",(ulong)uVar2,(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintFinResults( Vec_Wec_t * vClasses )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_WecForEachLevel( vClasses, vClass, i )
        Vec_IntForEachEntryStart( vClass, Entry, k, 1 )
            printf( "%d %d\n", Vec_IntEntry(vClass, 0), Entry );
}